

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::ServiceDescriptorProto::MergeFrom
          (ServiceDescriptorProto *this,ServiceDescriptorProto *from)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  LogMessage *other;
  ServiceOptions *pSVar4;
  undefined8 *puVar5;
  undefined1 *from_00;
  Arena *arena;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x15b9);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
            (&(this->method_).super_RepeatedPtrFieldBase,&(from->method_).super_RepeatedPtrFieldBase
            );
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      pvVar2 = (from->name_).tagged_ptr_.ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar5 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
      if ((uVar3 & 1) != 0) {
        puVar5 = (undefined8 *)*puVar5;
      }
      internal::ArenaStringPtr::Set(&this->name_,(ulong)pvVar2 & 0xfffffffffffffffe,puVar5);
    }
    if ((uVar1 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->options_ == (ServiceOptions *)0x0) {
        uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        arena = (Arena *)(uVar3 & 0xfffffffffffffffc);
        if ((uVar3 & 1) != 0) {
          arena = *(Arena **)arena;
        }
        pSVar4 = Arena::CreateMaybeMessage<google::protobuf::ServiceOptions>(arena);
        this->options_ = pSVar4;
      }
      from_00 = (undefined1 *)from->options_;
      if ((ServiceOptions *)from_00 == (ServiceOptions *)0x0) {
        from_00 = _ServiceOptions_default_instance_;
      }
      ServiceOptions::MergeFrom(this->options_,(ServiceOptions *)from_00);
    }
  }
  uVar3 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void ServiceDescriptorProto::MergeFrom(const ServiceDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ServiceDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  method_.MergeFrom(from.method_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->::PROTOBUF_NAMESPACE_ID::ServiceOptions::MergeFrom(from._internal_options());
    }
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}